

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O3

PrintStatus __thiscall
choc::html::HTMLElement::print<std::__cxx11::ostringstream>
          (HTMLElement *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out,
          size_t indent,PrintStatus status)

{
  size_t indent_00;
  pointer pbVar1;
  pointer pHVar2;
  ushort uVar3;
  PrintStatus PVar4;
  ostream *poVar5;
  PrintStatus PVar6;
  byte bVar7;
  HTMLElement *c;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  pointer pbVar8;
  long *local_58;
  long local_50;
  long local_48 [2];
  size_t local_38;
  
  bVar7 = status.isAtStartOfLine;
  local_38 = indent;
  if (((((ushort)status >> 8 | (ushort)status) & 1) == 0) &&
     (bVar7 = 1, this->contentIsInline == false)) {
    local_58 = (long *)CONCAT71(local_58._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_58,1);
  }
  bVar7 = (this->contentIsInline ^ 1U) & bVar7;
  if ((bVar7 & 1) != 0) {
    local_58 = local_48;
    std::__cxx11::string::_M_construct((ulong)&local_58,(char)local_38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)local_58,local_50);
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  local_58 = (long *)CONCAT71(local_58._1_7_,0x3c);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  pbVar8 = (this->properties).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->properties).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar1) {
    do {
      local_58 = (long *)CONCAT71(local_58._1_7_,0x20);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,(char *)&local_58,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar1);
  }
  local_58 = (long *)CONCAT71(local_58._1_7_,0x3e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)&local_58,1);
  this_00 = (this->children).
            super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (this->children).
           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 == pHVar2) {
    PVar6.isAtStartOfLine = false;
    PVar6.isFollowingContent = false;
    uVar3 = 0;
  }
  else {
    indent_00 = local_38 + 1;
    uVar3 = 0;
    PVar4.isAtStartOfLine = false;
    PVar4.isFollowingContent = false;
    do {
      if (this_00->isContent == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,(this_00->name)._M_dataplus._M_p,(this_00->name)._M_string_length)
        ;
        uVar3 = 1;
      }
      else {
        PVar4 = print<std::__cxx11::ostringstream>
                          (this_00,out,indent_00,(PrintStatus)((ushort)PVar4 & 0xff | uVar3 << 8));
        uVar3 = (ushort)PVar4 >> 8;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pHVar2);
    PVar6 = (PrintStatus)((ushort)PVar4 & 0xff);
  }
  if (((bVar7 & 1) != 0) &&
     ((this->children).
      super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->children).
      super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
      super__Vector_impl_data._M_finish && (uVar3 & 1) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
    local_58 = local_48;
    std::__cxx11::string::_M_construct((ulong)&local_58,(char)local_38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,(char *)local_58,local_50);
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"</",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,">",1);
  return PVar6;
}

Assistant:

PrintStatus print (Output& out, size_t indent, PrintStatus status) const
    {
        if (! (status.isAtStartOfLine || status.isFollowingContent))
        {
            if (! contentIsInline)
                out << '\n';

            status.isAtStartOfLine = true;
        }

        bool openTagIndented = status.isAtStartOfLine && ! contentIsInline;

        if (openTagIndented)
            out << std::string (indent, ' ');

        status.isAtStartOfLine = false;
        out << '<' << name;

        for (auto& p : properties)
            out << ' ' << p;

        out << '>';
        
        status.isFollowingContent = false;

        for (auto& c : children)
        {
            if (c.isContent)
            {
                out << c.name;
                status.isFollowingContent = true;
            }
            else
            {
                status = c.print (out, indent + 1, status);
            }
        }

        if (openTagIndented && ! (children.empty() || status.isFollowingContent))
            out << "\n" << std::string (indent, ' ');

        out << "</" << name << ">";

        status.isFollowingContent = false;
        return status;
    }